

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_create_all_obj_from_tval(command *cmd)

{
  object_kind *poVar1;
  _Bool _Var2;
  wchar_t wVar3;
  ulong uVar4;
  long lVar5;
  wchar_t tval;
  wchar_t art;
  char s [80];
  wchar_t local_dc;
  wchar_t local_d8 [20];
  char local_88 [88];
  
  wVar3 = cmd_get_arg_number((command_conflict *)cmd,"tval",&local_dc);
  if (wVar3 != L'\0') {
    local_88[0x40] = '\0';
    local_88[0x41] = '\0';
    local_88[0x42] = '\0';
    local_88[0x43] = '\0';
    local_88[0x44] = '\0';
    local_88[0x45] = '\0';
    local_88[0x46] = '\0';
    local_88[0x47] = '\0';
    local_88[0x48] = '\0';
    local_88[0x49] = '\0';
    local_88[0x4a] = '\0';
    local_88[0x4b] = '\0';
    local_88[0x4c] = '\0';
    local_88[0x4d] = '\0';
    local_88[0x4e] = '\0';
    local_88[0x4f] = '\0';
    local_88[0x30] = '\0';
    local_88[0x31] = '\0';
    local_88[0x32] = '\0';
    local_88[0x33] = '\0';
    local_88[0x34] = '\0';
    local_88[0x35] = '\0';
    local_88[0x36] = '\0';
    local_88[0x37] = '\0';
    local_88[0x38] = '\0';
    local_88[0x39] = '\0';
    local_88[0x3a] = '\0';
    local_88[0x3b] = '\0';
    local_88[0x3c] = '\0';
    local_88[0x3d] = '\0';
    local_88[0x3e] = '\0';
    local_88[0x3f] = '\0';
    local_88[0x20] = '\0';
    local_88[0x21] = '\0';
    local_88[0x22] = '\0';
    local_88[0x23] = '\0';
    local_88[0x24] = '\0';
    local_88[0x25] = '\0';
    local_88[0x26] = '\0';
    local_88[0x27] = '\0';
    local_88[0x28] = '\0';
    local_88[0x29] = '\0';
    local_88[0x2a] = '\0';
    local_88[0x2b] = '\0';
    local_88[0x2c] = '\0';
    local_88[0x2d] = '\0';
    local_88[0x2e] = '\0';
    local_88[0x2f] = '\0';
    local_88[0x10] = '\0';
    local_88[0x11] = '\0';
    local_88[0x12] = '\0';
    local_88[0x13] = '\0';
    local_88[0x14] = '\0';
    local_88[0x15] = '\0';
    local_88[0x16] = '\0';
    local_88[0x17] = '\0';
    local_88[0x18] = '\0';
    local_88[0x19] = '\0';
    local_88[0x1a] = '\0';
    local_88[0x1b] = '\0';
    local_88[0x1c] = '\0';
    local_88[0x1d] = '\0';
    local_88[0x1e] = '\0';
    local_88[0x1f] = '\0';
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    strnfmt((char *)local_d8,0x50,"Create all items of which tval (1-%d)? ",0x23);
    _Var2 = get_string((char *)local_d8,local_88,0x50);
    if (!_Var2) {
      return;
    }
    _Var2 = get_int_from_string(local_88,&local_dc);
    if (0x22 < (uint)(local_dc + L'\xffffffff') || !_Var2) {
      return;
    }
    cmd_set_arg_number((command_conflict *)cmd,"tval",local_dc);
  }
  wVar3 = cmd_get_arg_choice((command_conflict *)cmd,"choice",local_d8);
  if (wVar3 != L'\0') {
    _Var2 = get_check("Create instant artifacts? ");
    local_d8[0] = (wchar_t)_Var2;
    cmd_set_arg_choice((command_conflict *)cmd,"choice",local_d8[0]);
  }
  if (z_info->k_max != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      poVar1 = k_info;
      if ((*(wchar_t *)(k_info->flags + lVar5 + -0x5c) == local_dc) &&
         ((local_d8[0] != L'\0' ||
          (_Var2 = flag_has_dbg(k_info->kind_flags + lVar5,4,0x12,"kind->kind_flags","KF_INSTA_ART")
          , !_Var2)))) {
        wiz_create_object_from_kind((object_kind *)(poVar1->flags + lVar5 + -0x80));
        wiz_drop_object((object *)0x1340aa);
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x2c0;
    } while (uVar4 < z_info->k_max);
  }
  return;
}

Assistant:

void do_cmd_wiz_create_all_obj_from_tval(struct command *cmd)
{
	int tval, art;
	int i;

	if (cmd_get_arg_number(cmd, "tval", &tval) != CMD_OK) {
		char prompt[80];
		char s[80] = "";

		strnfmt(prompt, sizeof(prompt),
			"Create all items of which tval (1-%d)? ", TV_MAX - 1);
		if (!get_string(prompt, s, sizeof(s))) return;
		if (!get_int_from_string(s, &tval) || tval < 1 ||
			tval >= TV_MAX) return;
		cmd_set_arg_number(cmd, "tval", tval);
	}

	if (cmd_get_arg_choice(cmd, "choice", &art) != CMD_OK) {
		art = get_check("Create instant artifacts? ");
		cmd_set_arg_choice(cmd, "choice", art);
	}

	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];
		struct object *obj;

		if (kind->tval != tval ||
			(!art && kf_has(kind->kind_flags, KF_INSTA_ART))) continue;

		obj = wiz_create_object_from_kind(kind);
		wiz_drop_object(obj);
	}
}